

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *
dgrminer::compute_min_code
          (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
           *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  int *piVar1;
  mapped_type mVar2;
  int iVar3;
  int iVar4;
  pointer paVar5;
  array<int,_10UL> *pattern_edge1;
  pointer piVar6;
  int iVar7;
  pointer plVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  size_type __n;
  mapped_type *pmVar13;
  reference piVar14;
  _Elt_pointer piVar15;
  ulong uVar16;
  pointer piVar17;
  long lVar18;
  int j;
  size_type sVar19;
  ulong __n_00;
  int i;
  int iVar20;
  long lVar21;
  int i_1;
  reference rVar22;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  deque<int,_std::allocator<int>_> right_most_path;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<bool,_std::allocator<bool>_> selected_edges;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  array<int,_10UL> built_min_code_edge;
  value_type local_144;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  vector<int,_std::allocator<int>_> selected_candidates;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = ((long)(edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  lVar21 = 0;
  iVar10 = (int)uVar12;
  uVar16 = 0;
  if (0 < iVar10) {
    uVar16 = uVar12 & 0xffffffff;
  }
  for (; uVar16 * 0x28 - lVar21 != 0; lVar21 = lVar21 + 0x28) {
    flipPatternEdge((array<int,_10UL> *)
                    ((long)((edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar21));
    std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
    emplace_back<std::array<int,10ul>>
              ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
               (array<int,_10UL> *)&right_most_path);
  }
  starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  find_minimum_labelings(&indices_of_min_edges,edge_list,&starting_edges,true);
  iVar7 = iVar10 * 2;
  __n = (size_type)iVar10;
  piVar17 = indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (piVar17 ==
        indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    iVar20 = *piVar17;
    built_min_code_edge._M_elems[0] = 0;
    built_min_code_edge._M_elems[1] = 1;
    sVar19 = (size_type)iVar20;
    paVar5 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    built_min_code_edge._M_elems[2] = paVar5[sVar19]._M_elems[2];
    built_min_code_edge._M_elems[3] = paVar5[sVar19]._M_elems[3];
    built_min_code_edge._M_elems[4] = paVar5[sVar19]._M_elems[4];
    built_min_code_edge._M_elems[5] = paVar5[sVar19]._M_elems[5];
    built_min_code_edge._M_elems[6] = paVar5[sVar19]._M_elems[6];
    built_min_code_edge._M_elems[7] = paVar5[sVar19]._M_elems[7];
    built_min_code_edge._M_elems[8] = paVar5[sVar19]._M_elems[8];
    built_min_code_edge._M_elems[9] = paVar5[sVar19]._M_elems[9];
    pattern_edge1 =
         (__return_storage_ptr__->
         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl
         .super__Vector_impl_data._M_start;
    if (((__return_storage_ptr__->
         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl
         .super__Vector_impl_data._M_finish == pattern_edge1) ||
       (bVar9 = is_pattern_edge_smaller_than(pattern_edge1,&built_min_code_edge,true), !bVar9)) {
      built_min_code.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      built_min_code.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      built_min_code.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                (&built_min_code,&built_min_code_edge);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_map & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&selected_edges,(long)iVar7,(bool *)&right_most_path,
                 (allocator_type *)&right_most_path_occurrence);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_map._4_4_,0xffffffff);
      std::vector<int,_std::allocator<int>_>::vector
                (&selected_edges_ind,__n,(value_type_conflict1 *)&right_most_path,
                 (allocator_type *)&right_most_path_occurrence);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_map & 0xffffffff00000000);
      std::vector<int,_std::allocator<int>_>::vector
                (&selected_candidates,__n,(value_type_conflict1 *)&right_most_path,
                 (allocator_type *)&right_most_path_occurrence);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)0x0;
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map_size = 0;
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur = (_Elt_pointer)0x0;
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::vector(&all_edge_candidates,__n,(value_type *)&right_most_path,
               (allocator_type *)&right_most_path_occurrence);
      std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                    &right_most_path);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)0x0;
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map_size = 0;
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur = (_Elt_pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&all_edge_candidates_selected_edges_ind,__n,(value_type *)&right_most_path,
               (allocator_type *)&right_most_path_occurrence);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&right_most_path);
      *selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = iVar20;
      rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,sVar19);
      *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
      rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&selected_edges,(long)((iVar20 + iVar10) % iVar7));
      *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
      src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header;
      amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header;
      vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mVar2 = (edge_list->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start[sVar19]._M_elems[0];
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_map & 0xffffffff00000000);
      amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&vertex_id_mapping,(key_type *)&right_most_path);
      *pmVar13 = mVar2;
      mVar2 = (edge_list->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start[sVar19]._M_elems[1];
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_map._4_4_,1);
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&vertex_id_mapping,(key_type *)&right_most_path);
      *pmVar13 = mVar2;
      lVar21 = 0;
      for (uVar12 = 0;
          paVar5 = (edge_list->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)(((long)(edge_list->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar5) / 0x28
                          ); uVar12 = uVar12 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&src_vertices,(value_type_conflict1 *)((long)paVar5->_M_elems + lVar21));
        std::vector<int,_std::allocator<int>_>::push_back
                  (&dst_vertices,
                   (value_type_conflict1 *)
                   ((long)((edge_list->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar21 + 4));
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&amount_of_usage_of_original_vertices,
                             (key_type *)
                             ((long)((edge_list->
                                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar21)
                            );
        *pmVar13 = 0;
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&amount_of_usage_of_original_vertices,
                             (key_type *)
                             ((long)((edge_list->
                                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                             lVar21 + 4));
        *pmVar13 = 0;
        lVar21 = lVar21 + 0x28;
      }
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,paVar5[sVar19]._M_elems);
      *pmVar13 = 1;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,
                           (edge_list->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[sVar19]._M_elems + 1);
      *pmVar13 = 1;
      iVar20 = 1;
      while( true ) {
        if (iVar10 <= iVar20) {
          if ((__return_storage_ptr__->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish ==
              (__return_storage_ptr__->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                      (__return_storage_ptr__,&built_min_code);
          }
          else {
            bVar9 = is_code_smaller_than(&built_min_code,__return_storage_ptr__,true);
            if (bVar9) {
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                        (__return_storage_ptr__,&built_min_code);
            }
          }
          iVar20 = iVar20 + -1;
        }
        if (iVar20 == 0) break;
        iVar11 = selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar20];
        if (iVar11 == 0) {
          find_rightmost_path(&right_most_path,&built_min_code);
          std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
                    (&right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>);
          for (uVar12 = 0; sVar19 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
              uVar12 < sVar19; uVar12 = uVar12 + 1) {
            piVar14 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Deque_impl_data._M_start,uVar12);
            pmVar13 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&vertex_id_mapping,piVar14);
            std::deque<int,_std::allocator<int>_>::push_back
                      ((deque<int,_std::allocator<int>_> *)
                       &right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>,
                       pmVar13);
          }
          piVar15 = right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            piVar15 = right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          iVar11 = piVar15[-1];
          edge_candidates.
          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          edge_candidates.
          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          edge_candidates.
          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (uVar12 = 0; sVar19 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
              uVar12 < sVar19 - 1; uVar12 = uVar12 + 1) {
            piVar14 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                (&right_most_path_occurrence.
                                  super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_start,uVar12);
            iVar3 = *piVar14;
            lVar21 = 6;
            for (uVar16 = 0;
                uVar16 < (ulong)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset +
                         ((long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
                uVar16 = uVar16 + 1) {
              rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,uVar16);
              if ((((*rVar22._M_p & rVar22._M_mask) == 0) &&
                  (src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16] == iVar11)) &&
                 (dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16] == iVar3)) {
                piVar15 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur;
                if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  piVar15 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                }
                iVar4 = piVar15[-1];
                piVar14 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start,uVar12);
                local_144.elements._M_elems[1] = *piVar14;
                paVar5 = (edge_list->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                piVar1 = paVar5->_M_elems + lVar21 + -4;
                local_144.elements._M_elems._8_8_ = *(undefined8 *)piVar1;
                local_144.elements._M_elems._16_8_ = *(undefined8 *)(piVar1 + 2);
                piVar1 = paVar5->_M_elems + lVar21;
                local_144.elements._M_elems._24_8_ = *(undefined8 *)piVar1;
                local_144.elements._M_elems._32_8_ = *(undefined8 *)(piVar1 + 2);
                local_144.index = (int)uVar16;
                local_144.elements._M_elems[0] = iVar4;
                std::
                vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                ::push_back(&edge_candidates,&local_144);
              }
              lVar21 = lVar21 + 10;
            }
          }
          sVar19 = std::deque<int,_std::allocator<int>_>::size(&right_most_path);
          uVar12 = sVar19 & 0xffffffff;
          while( true ) {
            uVar12 = uVar12 - 1;
            if ((int)(uint)uVar12 < 0) break;
            uVar16 = (ulong)((uint)uVar12 & 0x7fffffff);
            piVar14 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                (&right_most_path_occurrence.
                                  super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_start,uVar16);
            iVar11 = *piVar14;
            lVar21 = 6;
            lVar18 = 0;
            for (__n_00 = 0;
                __n_00 < (ulong)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset +
                         ((long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
                __n_00 = __n_00 + 1) {
              rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,__n_00);
              if ((((*rVar22._M_p & rVar22._M_mask) == 0) &&
                  (src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[__n_00] == iVar11)) &&
                 (pmVar13 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[](&amount_of_usage_of_original_vertices,
                                         (key_type *)
                                         ((long)dst_vertices.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start + lVar18)),
                 *pmVar13 == 0)) {
                piVar14 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start,uVar16);
                piVar15 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur;
                if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  piVar15 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                }
                local_144.elements._M_elems[0] = *piVar14;
                local_144.elements._M_elems[1] = piVar15[-1] + 1;
                paVar5 = (edge_list->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                piVar1 = paVar5->_M_elems + lVar21 + -4;
                local_144.elements._M_elems._8_8_ = *(undefined8 *)piVar1;
                local_144.elements._M_elems._16_8_ = *(undefined8 *)(piVar1 + 2);
                piVar1 = paVar5->_M_elems + lVar21;
                local_144.elements._M_elems._24_8_ = *(undefined8 *)piVar1;
                local_144.elements._M_elems._32_8_ = *(undefined8 *)(piVar1 + 2);
                local_144.index = (int)__n_00;
                std::
                vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                ::push_back(&edge_candidates,&local_144);
              }
              lVar18 = lVar18 + 4;
              lVar21 = lVar21 + 10;
            }
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                    ((__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                      )edge_candidates.
                       super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                      )edge_candidates.
                       super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                      )0x11a448);
          paVar5 = all_edge_candidates.
                   super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar20].
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (all_edge_candidates.
              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar20].
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish != paVar5) {
            all_edge_candidates.
            super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar20].
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = paVar5;
          }
          piVar6 = all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar20].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if (all_edge_candidates_selected_edges_ind.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar20].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish != piVar6) {
            all_edge_candidates_selected_edges_ind.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar20].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = piVar6;
          }
          lVar21 = 0x28;
          uVar12 = 0;
          while ((plVar8 = edge_candidates.
                           super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                 uVar12 < (ulong)(((long)edge_candidates.
                                         super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)edge_candidates.
                                        super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x2c) &&
                 ((uVar12 == 0 ||
                  (bVar9 = is_pattern_edge_smaller_than
                                     ((array<int,_10UL> *)
                                      ((long)((edge_candidates.
                                               super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->elements)
                                             ._M_elems + lVar21 + -0x54),
                                      (array<int,_10UL> *)
                                      ((long)(&(edge_candidates.
                                                super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->elements
                                             + -1) + lVar21),true), !bVar9))))) {
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      (all_edge_candidates.
                       super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar20,
                       (value_type *)((long)(&plVar8->elements + -1) + lVar21));
            std::vector<int,_std::allocator<int>_>::push_back
                      (all_edge_candidates_selected_edges_ind.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar20,
                       (value_type_conflict1 *)
                       ((long)((edge_candidates.
                                super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                ._M_impl.super__Vector_impl_data._M_start)->elements)._M_elems +
                       lVar21));
            uVar12 = uVar12 + 1;
            lVar21 = lVar21 + 0x2c;
          }
          std::
          _Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ::~_Vector_base(&edge_candidates.
                           super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                         );
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    (&right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>);
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>);
          iVar11 = selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar20];
        }
        uVar12 = (ulong)iVar11;
        paVar5 = all_edge_candidates.
                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar20].
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (uVar12 < (ulong)(((long)all_edge_candidates.
                                    super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar20].
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5) /
                            0x28)) {
          selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar20] = iVar11 + 1;
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    (&built_min_code,paVar5 + uVar12);
          mVar2 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar20].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar12]]._M_elems[0];
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 all_edge_candidates.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar20].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_elems);
          *pmVar13 = mVar2;
          mVar2 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar20].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar12]]._M_elems[1];
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 all_edge_candidates.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar20].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_elems + 1);
          *pmVar13 = mVar2;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [all_edge_candidates_selected_edges_ind.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar20].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar12]]._M_elems);
          *pmVar13 = *pmVar13 + 1;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [all_edge_candidates_selected_edges_ind.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar20].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar12]]._M_elems + 1);
          *pmVar13 = *pmVar13 + 1;
          iVar11 = all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar20].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar12];
          selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar20] = iVar11;
          rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&selected_edges,(long)iVar11);
          *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
          rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&selected_edges,(long)((iVar11 + iVar10) % iVar7));
          *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
          iVar20 = iVar20 + 1;
        }
        else {
          selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar20] = 0;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 built_min_code.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
          right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_map._4_4_,*pmVar13);
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 built_min_code.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
          right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_map._0_4_ = *pmVar13;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,(key_type *)&right_most_path)
          ;
          *pmVar13 = *pmVar13 + -1;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,
                                 (key_type *)&right_most_path_occurrence);
          *pmVar13 = *pmVar13 + -1;
          built_min_code.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               built_min_code.
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
          iVar11 = selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar20];
          if ((long)iVar11 != 0xffffffffffffffff) {
            rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&selected_edges,(long)iVar11);
            *rVar22._M_p = *rVar22._M_p & ~rVar22._M_mask;
            rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&selected_edges,(long)((iVar11 + iVar10) % iVar7));
            *rVar22._M_p = *rVar22._M_p & ~rVar22._M_mask;
            selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar20] = -1;
          }
          iVar20 = iVar20 + -1;
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&vertex_id_mapping._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&amount_of_usage_of_original_vertices._M_t);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dst_vertices.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&src_vertices.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&all_edge_candidates_selected_edges_ind);
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::~vector(&all_edge_candidates);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&selected_candidates.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&selected_edges.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
      ~_Vector_base(&built_min_code.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   );
    }
    piVar17 = piVar17 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&starting_edges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 10>> compute_min_code(std::vector<std::array<int, 10>> edge_list)
    {

        //here we will eventually save the minimum code
        //at the end, we compare it with the current code and decide
        std::vector<std::array<int, 10>> minimum_code;


        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        std::vector<std::array<int, 8>> starting_edges;

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, true);

        for (int min_edge_ind : indices_of_min_edges)
        {
            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            // if we already have some min code saved, try to compare the current pattern being built
            // if the current min code is smaller, then just try another init edge
            if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[0], built_min_code_edge, true))
            {
                continue;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    // we generated a code from all edges

                    // we did not generate a smaller code,
                    // try different code (the next one may be even smaller)
                    if (minimum_code.size() == 0)
                    {
                        // just save this first code as minimum
                        minimum_code = built_min_code;
                    }
                    else
                    {
                        // compare it with the latest "minimum code" and if necessary, save the new one:
                        bool is_new_code_smaller = is_code_smaller_than(built_min_code, minimum_code, true);
                        if (is_new_code_smaller)
                        {
                            minimum_code = built_min_code;
                        }
                    }
                    // backtrack
                    current_index--;

                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {

                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }


                // try to use the candidates

                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {


                    //if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[current_index], all_edge_candidates[current_index][edge_candidate_ind], true))
                    //{
                    //	// we should backtrack
                    //	break;
                    //}

                    //if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true))
                    //{
                    // they are same, so append it and move to other edge
                    // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                    selected_candidates[current_index] = edge_candidate_ind + 1;
                    built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                    int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                    selected_edges_ind[current_index] = sel_e_ind;
                    selected_edges[sel_e_ind] = true;
                    selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                    current_index++;
                    should_backtrack = false;
                    break;
                    //}
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return minimum_code;
    }